

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Scene *pSVar17;
  float **ppfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  Geometry *pGVar23;
  RTCFilterFunctionN p_Var24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar32;
  int iVar33;
  NodeRef *pNVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  NodeRef *pNVar40;
  size_t sVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar62;
  float fVar64;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar52;
  float fVar63;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar68;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  float fVar74;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar75 [16];
  float fVar80;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar93 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar100 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar113 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [16];
  UVIdentity<4> mapUV;
  NodeRef *local_b50;
  undefined1 local_ae8 [16];
  undefined1 (*local_ad8) [16];
  ulong local_ad0;
  long local_ac8;
  long local_ac0;
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined1 local_8f8 [16];
  UVIdentity<4> *local_8e8;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar10 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar11 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar12 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar92 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar110 = fVar92 * 0.99999964;
  fVar120 = fVar94 * 0.99999964;
  fVar96 = fVar95 * 0.99999964;
  fVar92 = fVar92 * 1.0000004;
  fVar94 = fVar94 * 1.0000004;
  fVar95 = fVar95 * 1.0000004;
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar37 = uVar39 ^ 0x10;
  iVar13 = (tray->tnear).field_0.i[k];
  iVar14 = (tray->tfar).field_0.i[k];
  local_ad8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_b50 = stack + 1;
  local_ad0 = uVar39;
LAB_006f567e:
  do {
    pNVar40 = local_b50;
    if (pNVar40 == stack) {
LAB_006f60ea:
      return pNVar40 != stack;
    }
    pNVar34 = pNVar40 + -1;
    sVar41 = pNVar40[-1].ptr;
    local_b50 = pNVar34;
    while ((sVar41 & 8) == 0) {
      pfVar8 = (float *)(sVar41 + 0x20 + uVar39);
      auVar57._0_4_ = (*pfVar8 - fVar10) * fVar110;
      auVar57._4_4_ = (pfVar8[1] - fVar10) * fVar110;
      auVar57._8_4_ = (pfVar8[2] - fVar10) * fVar110;
      auVar57._12_4_ = (pfVar8[3] - fVar10) * fVar110;
      pfVar8 = (float *)(sVar41 + 0x20 + uVar36);
      auVar53._0_4_ = (*pfVar8 - fVar11) * fVar120;
      auVar53._4_4_ = (pfVar8[1] - fVar11) * fVar120;
      auVar53._8_4_ = (pfVar8[2] - fVar11) * fVar120;
      auVar53._12_4_ = (pfVar8[3] - fVar11) * fVar120;
      auVar43 = maxps(auVar57,auVar53);
      pfVar8 = (float *)(sVar41 + 0x20 + uVar42);
      auVar54._0_4_ = (*pfVar8 - fVar12) * fVar96;
      auVar54._4_4_ = (pfVar8[1] - fVar12) * fVar96;
      auVar54._8_4_ = (pfVar8[2] - fVar12) * fVar96;
      auVar54._12_4_ = (pfVar8[3] - fVar12) * fVar96;
      auVar55._4_4_ = iVar13;
      auVar55._0_4_ = iVar13;
      auVar55._8_4_ = iVar13;
      auVar55._12_4_ = iVar13;
      auVar55 = maxps(auVar54,auVar55);
      auVar55 = maxps(auVar43,auVar55);
      pfVar8 = (float *)(sVar41 + 0x20 + uVar37);
      auVar56._0_4_ = (*pfVar8 - fVar10) * fVar92;
      auVar56._4_4_ = (pfVar8[1] - fVar10) * fVar92;
      auVar56._8_4_ = (pfVar8[2] - fVar10) * fVar92;
      auVar56._12_4_ = (pfVar8[3] - fVar10) * fVar92;
      pfVar8 = (float *)(sVar41 + 0x20 + (uVar36 ^ 0x10));
      auVar69._0_4_ = (*pfVar8 - fVar11) * fVar94;
      auVar69._4_4_ = (pfVar8[1] - fVar11) * fVar94;
      auVar69._8_4_ = (pfVar8[2] - fVar11) * fVar94;
      auVar69._12_4_ = (pfVar8[3] - fVar11) * fVar94;
      auVar57 = minps(auVar56,auVar69);
      pfVar8 = (float *)(sVar41 + 0x20 + (uVar42 ^ 0x10));
      auVar70._0_4_ = (*pfVar8 - fVar12) * fVar95;
      auVar70._4_4_ = (pfVar8[1] - fVar12) * fVar95;
      auVar70._8_4_ = (pfVar8[2] - fVar12) * fVar95;
      auVar70._12_4_ = (pfVar8[3] - fVar12) * fVar95;
      auVar43._4_4_ = iVar14;
      auVar43._0_4_ = iVar14;
      auVar43._8_4_ = iVar14;
      auVar43._12_4_ = iVar14;
      auVar43 = minps(auVar70,auVar43);
      auVar43 = minps(auVar57,auVar43);
      auVar44._4_4_ = -(uint)(auVar55._4_4_ <= auVar43._4_4_);
      auVar44._0_4_ = -(uint)(auVar55._0_4_ <= auVar43._0_4_);
      auVar44._8_4_ = -(uint)(auVar55._8_4_ <= auVar43._8_4_);
      auVar44._12_4_ = -(uint)(auVar55._12_4_ <= auVar43._12_4_);
      uVar32 = movmskps((int)pNVar34,auVar44);
      if (uVar32 == 0) goto LAB_006f567e;
      uVar32 = uVar32 & 0xff;
      pNVar34 = (NodeRef *)(sVar41 & 0xfffffffffffffff0);
      lVar35 = 0;
      if (uVar32 != 0) {
        for (; (uVar32 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
        }
      }
      sVar41 = pNVar34[lVar35].ptr;
      uVar32 = uVar32 - 1 & uVar32;
      uVar38 = (ulong)uVar32;
      if (uVar32 != 0) {
        do {
          local_b50->ptr = sVar41;
          local_b50 = local_b50 + 1;
          lVar35 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          sVar41 = pNVar34[lVar35].ptr;
          uVar38 = uVar38 - 1 & uVar38;
        } while (uVar38 != 0);
      }
    }
    local_ac0 = (ulong)((uint)sVar41 & 0xf) - 8;
    uVar38 = sVar41 & 0xfffffffffffffff0;
    for (local_ac8 = 0; local_ac8 != local_ac0; local_ac8 = local_ac8 + 1) {
      lVar35 = local_ac8 * 0x50;
      pSVar17 = context->scene;
      ppfVar18 = (pSVar17->vertices).items;
      pfVar19 = ppfVar18[*(uint *)(uVar38 + 0x30 + lVar35)];
      pfVar8 = pfVar19 + *(uint *)(uVar38 + lVar35);
      pfVar1 = pfVar19 + *(uint *)(uVar38 + 0x10 + lVar35);
      pfVar19 = pfVar19 + *(uint *)(uVar38 + 0x20 + lVar35);
      pfVar20 = ppfVar18[*(uint *)(uVar38 + 0x34 + lVar35)];
      pfVar2 = pfVar20 + *(uint *)(uVar38 + 4 + lVar35);
      pfVar3 = pfVar20 + *(uint *)(uVar38 + 0x14 + lVar35);
      pfVar20 = pfVar20 + *(uint *)(uVar38 + 0x24 + lVar35);
      pfVar21 = ppfVar18[*(uint *)(uVar38 + 0x38 + lVar35)];
      pfVar4 = pfVar21 + *(uint *)(uVar38 + 8 + lVar35);
      pfVar5 = pfVar21 + *(uint *)(uVar38 + 0x18 + lVar35);
      pfVar21 = pfVar21 + *(uint *)(uVar38 + 0x28 + lVar35);
      pfVar22 = ppfVar18[*(uint *)(uVar38 + 0x3c + lVar35)];
      pfVar6 = pfVar22 + *(uint *)(uVar38 + 0xc + lVar35);
      pfVar7 = pfVar22 + *(uint *)(uVar38 + 0x1c + lVar35);
      pfVar22 = pfVar22 + *(uint *)(uVar38 + 0x2c + lVar35);
      puVar9 = (undefined8 *)(uVar38 + 0x30 + lVar35);
      local_928 = *puVar9;
      uStack_920 = puVar9[1];
      puVar9 = (undefined8 *)(uVar38 + 0x40 + lVar35);
      local_938 = *puVar9;
      uStack_930 = puVar9[1];
      fVar124 = *(float *)(ray + k * 4);
      fVar79 = *(float *)(ray + k * 4 + 0x10);
      fVar85 = *(float *)(ray + k * 4 + 0x20);
      fVar125 = *pfVar8 - fVar124;
      fVar126 = *pfVar2 - fVar124;
      fVar127 = *pfVar4 - fVar124;
      fVar128 = *pfVar6 - fVar124;
      fVar129 = pfVar8[1] - fVar79;
      fVar131 = pfVar2[1] - fVar79;
      fVar133 = pfVar4[1] - fVar79;
      fVar135 = pfVar6[1] - fVar79;
      fVar141 = pfVar8[2] - fVar85;
      fVar144 = pfVar2[2] - fVar85;
      fVar146 = pfVar4[2] - fVar85;
      fVar148 = pfVar6[2] - fVar85;
      fVar51 = *pfVar1 - fVar124;
      fVar62 = *pfVar3 - fVar124;
      fVar64 = *pfVar5 - fVar124;
      fVar66 = *pfVar7 - fVar124;
      fVar68 = pfVar1[1] - fVar79;
      fVar71 = pfVar3[1] - fVar79;
      fVar72 = pfVar5[1] - fVar79;
      fVar73 = pfVar7[1] - fVar79;
      fVar97 = pfVar1[2] - fVar85;
      fVar101 = pfVar3[2] - fVar85;
      fVar104 = pfVar5[2] - fVar85;
      fVar107 = pfVar7[2] - fVar85;
      fVar121 = *pfVar19 - fVar124;
      fVar122 = *pfVar20 - fVar124;
      fVar123 = *pfVar21 - fVar124;
      fVar124 = *pfVar22 - fVar124;
      fVar74 = pfVar19[1] - fVar79;
      fVar76 = pfVar20[1] - fVar79;
      fVar77 = pfVar21[1] - fVar79;
      fVar79 = pfVar22[1] - fVar79;
      fVar80 = pfVar19[2] - fVar85;
      fVar83 = pfVar20[2] - fVar85;
      fVar84 = pfVar21[2] - fVar85;
      fVar85 = pfVar22[2] - fVar85;
      fVar98 = fVar121 - fVar125;
      fVar102 = fVar122 - fVar126;
      fVar105 = fVar123 - fVar127;
      fVar108 = fVar124 - fVar128;
      fVar137 = fVar74 - fVar129;
      fVar138 = fVar76 - fVar131;
      fVar139 = fVar77 - fVar133;
      fVar140 = fVar79 - fVar135;
      fVar111 = fVar80 - fVar141;
      fVar114 = fVar83 - fVar144;
      fVar116 = fVar84 - fVar146;
      fVar118 = fVar85 - fVar148;
      fVar78 = *(float *)(ray + k * 4 + 0x50);
      fVar87 = *(float *)(ray + k * 4 + 0x60);
      fVar89 = *(float *)(ray + k * 4 + 0x40);
      local_918 = (fVar137 * (fVar80 + fVar141) - (fVar74 + fVar129) * fVar111) * fVar89 +
                  ((fVar121 + fVar125) * fVar111 - (fVar80 + fVar141) * fVar98) * fVar78 +
                  (fVar98 * (fVar74 + fVar129) - (fVar121 + fVar125) * fVar137) * fVar87;
      fStack_914 = (fVar138 * (fVar83 + fVar144) - (fVar76 + fVar131) * fVar114) * fVar89 +
                   ((fVar122 + fVar126) * fVar114 - (fVar83 + fVar144) * fVar102) * fVar78 +
                   (fVar102 * (fVar76 + fVar131) - (fVar122 + fVar126) * fVar138) * fVar87;
      fStack_910 = (fVar139 * (fVar84 + fVar146) - (fVar77 + fVar133) * fVar116) * fVar89 +
                   ((fVar123 + fVar127) * fVar116 - (fVar84 + fVar146) * fVar105) * fVar78 +
                   (fVar105 * (fVar77 + fVar133) - (fVar123 + fVar127) * fVar139) * fVar87;
      fStack_90c = (fVar140 * (fVar85 + fVar148) - (fVar79 + fVar135) * fVar118) * fVar89 +
                   ((fVar124 + fVar128) * fVar118 - (fVar85 + fVar148) * fVar108) * fVar78 +
                   (fVar108 * (fVar79 + fVar135) - (fVar124 + fVar128) * fVar140) * fVar87;
      fVar99 = fVar125 - fVar51;
      fVar103 = fVar126 - fVar62;
      fVar106 = fVar127 - fVar64;
      fVar109 = fVar128 - fVar66;
      fVar112 = fVar129 - fVar68;
      fVar115 = fVar131 - fVar71;
      fVar117 = fVar133 - fVar72;
      fVar119 = fVar135 - fVar73;
      fVar52 = fVar141 - fVar97;
      fVar63 = fVar144 - fVar101;
      fVar65 = fVar146 - fVar104;
      fVar67 = fVar148 - fVar107;
      local_908 = (fVar112 * (fVar141 + fVar97) - (fVar129 + fVar68) * fVar52) * fVar89 +
                  ((fVar125 + fVar51) * fVar52 - (fVar141 + fVar97) * fVar99) * fVar78 +
                  (fVar99 * (fVar129 + fVar68) - (fVar125 + fVar51) * fVar112) * fVar87;
      fStack_904 = (fVar115 * (fVar144 + fVar101) - (fVar131 + fVar71) * fVar63) * fVar89 +
                   ((fVar126 + fVar62) * fVar63 - (fVar144 + fVar101) * fVar103) * fVar78 +
                   (fVar103 * (fVar131 + fVar71) - (fVar126 + fVar62) * fVar115) * fVar87;
      fStack_900 = (fVar117 * (fVar146 + fVar104) - (fVar133 + fVar72) * fVar65) * fVar89 +
                   ((fVar127 + fVar64) * fVar65 - (fVar146 + fVar104) * fVar106) * fVar78 +
                   (fVar106 * (fVar133 + fVar72) - (fVar127 + fVar64) * fVar117) * fVar87;
      fStack_8fc = (fVar119 * (fVar148 + fVar107) - (fVar135 + fVar73) * fVar67) * fVar89 +
                   ((fVar128 + fVar66) * fVar67 - (fVar148 + fVar107) * fVar109) * fVar78 +
                   (fVar109 * (fVar135 + fVar73) - (fVar128 + fVar66) * fVar119) * fVar87;
      fVar142 = fVar51 - fVar121;
      fVar145 = fVar62 - fVar122;
      fVar147 = fVar64 - fVar123;
      fVar149 = fVar66 - fVar124;
      fVar86 = fVar68 - fVar74;
      fVar88 = fVar71 - fVar76;
      fVar90 = fVar72 - fVar77;
      fVar91 = fVar73 - fVar79;
      fVar130 = fVar97 - fVar80;
      fVar132 = fVar101 - fVar83;
      fVar134 = fVar104 - fVar84;
      fVar136 = fVar107 - fVar85;
      auVar58._0_4_ =
           (fVar86 * (fVar80 + fVar97) - (fVar74 + fVar68) * fVar130) * fVar89 +
           ((fVar121 + fVar51) * fVar130 - (fVar80 + fVar97) * fVar142) * fVar78 +
           (fVar142 * (fVar74 + fVar68) - (fVar121 + fVar51) * fVar86) * fVar87;
      auVar58._4_4_ =
           (fVar88 * (fVar83 + fVar101) - (fVar76 + fVar71) * fVar132) * fVar89 +
           ((fVar122 + fVar62) * fVar132 - (fVar83 + fVar101) * fVar145) * fVar78 +
           (fVar145 * (fVar76 + fVar71) - (fVar122 + fVar62) * fVar88) * fVar87;
      auVar58._8_4_ =
           (fVar90 * (fVar84 + fVar104) - (fVar77 + fVar72) * fVar134) * fVar89 +
           ((fVar123 + fVar64) * fVar134 - (fVar84 + fVar104) * fVar147) * fVar78 +
           (fVar147 * (fVar77 + fVar72) - (fVar123 + fVar64) * fVar90) * fVar87;
      auVar58._12_4_ =
           (fVar91 * (fVar85 + fVar107) - (fVar79 + fVar73) * fVar136) * fVar89 +
           ((fVar124 + fVar66) * fVar136 - (fVar85 + fVar107) * fVar149) * fVar78 +
           (fVar149 * (fVar79 + fVar73) - (fVar124 + fVar66) * fVar91) * fVar87;
      fVar62 = local_918 + local_908 + auVar58._0_4_;
      fVar64 = fStack_914 + fStack_904 + auVar58._4_4_;
      fVar66 = fStack_910 + fStack_900 + auVar58._8_4_;
      fVar68 = fStack_90c + fStack_8fc + auVar58._12_4_;
      auVar45._8_4_ = fStack_910;
      auVar45._0_8_ = CONCAT44(fStack_914,local_918);
      auVar45._12_4_ = fStack_90c;
      auVar26._4_4_ = fStack_904;
      auVar26._0_4_ = local_908;
      auVar26._8_4_ = fStack_900;
      auVar26._12_4_ = fStack_8fc;
      auVar55 = minps(auVar45,auVar26);
      auVar55 = minps(auVar55,auVar58);
      auVar81._8_4_ = fStack_910;
      auVar81._0_8_ = CONCAT44(fStack_914,local_918);
      auVar81._12_4_ = fStack_90c;
      auVar27._4_4_ = fStack_904;
      auVar27._0_4_ = local_908;
      auVar27._8_4_ = fStack_900;
      auVar27._12_4_ = fStack_8fc;
      auVar43 = maxps(auVar81,auVar27);
      auVar43 = maxps(auVar43,auVar58);
      fVar124 = ABS(fVar62) * 1.1920929e-07;
      fVar79 = ABS(fVar64) * 1.1920929e-07;
      fVar85 = ABS(fVar66) * 1.1920929e-07;
      fVar51 = ABS(fVar68) * 1.1920929e-07;
      auVar82._4_4_ = -(uint)(auVar43._4_4_ <= fVar79);
      auVar82._0_4_ = -(uint)(auVar43._0_4_ <= fVar124);
      auVar82._8_4_ = -(uint)(auVar43._8_4_ <= fVar85);
      auVar82._12_4_ = -(uint)(auVar43._12_4_ <= fVar51);
      auVar46._4_4_ = -(uint)(-fVar79 <= auVar55._4_4_);
      auVar46._0_4_ = -(uint)(-fVar124 <= auVar55._0_4_);
      auVar46._8_4_ = -(uint)(-fVar85 <= auVar55._8_4_);
      auVar46._12_4_ = -(uint)(-fVar51 <= auVar55._12_4_);
      auVar82 = auVar82 | auVar46;
      iVar33 = movmskps((int)lVar35,auVar82);
      if (iVar33 != 0) {
        auVar113._0_4_ = fVar112 * fVar130 - fVar86 * fVar52;
        auVar113._4_4_ = fVar115 * fVar132 - fVar88 * fVar63;
        auVar113._8_4_ = fVar117 * fVar134 - fVar90 * fVar65;
        auVar113._12_4_ = fVar119 * fVar136 - fVar91 * fVar67;
        auVar47._4_4_ = -(uint)(ABS(fVar115 * fVar114) < ABS(fVar88 * fVar63));
        auVar47._0_4_ = -(uint)(ABS(fVar112 * fVar111) < ABS(fVar86 * fVar52));
        auVar47._8_4_ = -(uint)(ABS(fVar117 * fVar116) < ABS(fVar90 * fVar65));
        auVar47._12_4_ = -(uint)(ABS(fVar119 * fVar118) < ABS(fVar91 * fVar67));
        auVar30._4_4_ = fVar138 * fVar63 - fVar115 * fVar114;
        auVar30._0_4_ = fVar137 * fVar52 - fVar112 * fVar111;
        auVar30._8_4_ = fVar139 * fVar65 - fVar117 * fVar116;
        auVar30._12_4_ = fVar140 * fVar67 - fVar119 * fVar118;
        local_898 = blendvps(auVar113,auVar30,auVar47);
        auVar143._0_4_ = fVar142 * fVar52 - fVar99 * fVar130;
        auVar143._4_4_ = fVar145 * fVar63 - fVar103 * fVar132;
        auVar143._8_4_ = fVar147 * fVar65 - fVar106 * fVar134;
        auVar143._12_4_ = fVar149 * fVar67 - fVar109 * fVar136;
        auVar48._4_4_ = -(uint)(ABS(fVar102 * fVar63) < ABS(fVar103 * fVar132));
        auVar48._0_4_ = -(uint)(ABS(fVar98 * fVar52) < ABS(fVar99 * fVar130));
        auVar48._8_4_ = -(uint)(ABS(fVar105 * fVar65) < ABS(fVar106 * fVar134));
        auVar48._12_4_ = -(uint)(ABS(fVar108 * fVar67) < ABS(fVar109 * fVar136));
        auVar28._4_4_ = fVar114 * fVar103 - fVar102 * fVar63;
        auVar28._0_4_ = fVar111 * fVar99 - fVar98 * fVar52;
        auVar28._8_4_ = fVar116 * fVar106 - fVar105 * fVar65;
        auVar28._12_4_ = fVar118 * fVar109 - fVar108 * fVar67;
        local_888 = blendvps(auVar143,auVar28,auVar48);
        auVar100._0_4_ = fVar99 * fVar86 - fVar142 * fVar112;
        auVar100._4_4_ = fVar103 * fVar88 - fVar145 * fVar115;
        auVar100._8_4_ = fVar106 * fVar90 - fVar147 * fVar117;
        auVar100._12_4_ = fVar109 * fVar91 - fVar149 * fVar119;
        auVar49._4_4_ = -(uint)(ABS(fVar103 * fVar138) < ABS(fVar145 * fVar115));
        auVar49._0_4_ = -(uint)(ABS(fVar99 * fVar137) < ABS(fVar142 * fVar112));
        auVar49._8_4_ = -(uint)(ABS(fVar106 * fVar139) < ABS(fVar147 * fVar117));
        auVar49._12_4_ = -(uint)(ABS(fVar109 * fVar140) < ABS(fVar149 * fVar119));
        auVar31._4_4_ = fVar102 * fVar115 - fVar103 * fVar138;
        auVar31._0_4_ = fVar98 * fVar112 - fVar99 * fVar137;
        auVar31._8_4_ = fVar105 * fVar117 - fVar106 * fVar139;
        auVar31._12_4_ = fVar108 * fVar119 - fVar109 * fVar140;
        local_878 = blendvps(auVar100,auVar31,auVar49);
        fVar63 = fVar89 * local_898._0_4_ + fVar78 * local_888._0_4_ + fVar87 * local_878._0_4_;
        fVar65 = fVar89 * local_898._4_4_ + fVar78 * local_888._4_4_ + fVar87 * local_878._4_4_;
        fVar67 = fVar89 * local_898._8_4_ + fVar78 * local_888._8_4_ + fVar87 * local_878._8_4_;
        fVar71 = fVar89 * local_898._12_4_ + fVar78 * local_888._12_4_ + fVar87 * local_878._12_4_;
        fVar63 = fVar63 + fVar63;
        fVar65 = fVar65 + fVar65;
        fVar67 = fVar67 + fVar67;
        fVar71 = fVar71 + fVar71;
        auVar59._0_4_ = fVar141 * local_878._0_4_;
        auVar59._4_4_ = fVar144 * local_878._4_4_;
        auVar59._8_4_ = fVar146 * local_878._8_4_;
        auVar59._12_4_ = fVar148 * local_878._12_4_;
        fVar87 = fVar125 * local_898._0_4_ + fVar129 * local_888._0_4_ + auVar59._0_4_;
        fVar89 = fVar126 * local_898._4_4_ + fVar131 * local_888._4_4_ + auVar59._4_4_;
        fVar51 = fVar127 * local_898._8_4_ + fVar133 * local_888._8_4_ + auVar59._8_4_;
        fVar52 = fVar128 * local_898._12_4_ + fVar135 * local_888._12_4_ + auVar59._12_4_;
        auVar29._4_4_ = fVar65;
        auVar29._0_4_ = fVar63;
        auVar29._8_4_ = fVar67;
        auVar29._12_4_ = fVar71;
        auVar55 = rcpps(auVar59,auVar29);
        fVar124 = auVar55._0_4_;
        fVar79 = auVar55._4_4_;
        fVar85 = auVar55._8_4_;
        fVar78 = auVar55._12_4_;
        local_8a8._0_4_ = ((1.0 - fVar63 * fVar124) * fVar124 + fVar124) * (fVar87 + fVar87);
        local_8a8._4_4_ = ((1.0 - fVar65 * fVar79) * fVar79 + fVar79) * (fVar89 + fVar89);
        local_8a8._8_4_ = ((1.0 - fVar67 * fVar85) * fVar85 + fVar85) * (fVar51 + fVar51);
        local_8a8._12_4_ = ((1.0 - fVar71 * fVar78) * fVar78 + fVar78) * (fVar52 + fVar52);
        fVar124 = *(float *)(ray + k * 4 + 0x80);
        fVar79 = *(float *)(ray + k * 4 + 0x30);
        auVar60._0_4_ =
             -(uint)(local_8a8._0_4_ <= fVar124 && fVar79 <= local_8a8._0_4_) & auVar82._0_4_;
        auVar60._4_4_ =
             -(uint)(local_8a8._4_4_ <= fVar124 && fVar79 <= local_8a8._4_4_) & auVar82._4_4_;
        auVar60._8_4_ =
             -(uint)(local_8a8._8_4_ <= fVar124 && fVar79 <= local_8a8._8_4_) & auVar82._8_4_;
        auVar60._12_4_ =
             -(uint)(local_8a8._12_4_ <= fVar124 && fVar79 <= local_8a8._12_4_) & auVar82._12_4_;
        iVar33 = movmskps(iVar33,auVar60);
        if (iVar33 != 0) {
          local_8d8._0_4_ = auVar60._0_4_ & -(uint)(fVar63 != 0.0);
          local_8d8._4_4_ = auVar60._4_4_ & -(uint)(fVar65 != 0.0);
          local_8d8._8_4_ = auVar60._8_4_ & -(uint)(fVar67 != 0.0);
          local_8d8._12_4_ = auVar60._12_4_ & -(uint)(fVar71 != 0.0);
          uVar32 = movmskps(iVar33,local_8d8);
          if (uVar32 != 0) {
            local_8f8._4_4_ = fVar64;
            local_8f8._0_4_ = fVar62;
            local_8f8._8_4_ = fVar66;
            local_8f8._12_4_ = fVar68;
            local_8e8 = &mapUV;
            auVar55 = rcpps(local_8a8,local_8f8);
            fVar79 = auVar55._0_4_;
            fVar85 = auVar55._4_4_;
            fVar78 = auVar55._8_4_;
            fVar87 = auVar55._12_4_;
            fVar79 = (float)(-(uint)(1e-18 <= ABS(fVar62)) &
                            (uint)(((float)DAT_01f46a60 - fVar62 * fVar79) * fVar79 + fVar79));
            fVar85 = (float)(-(uint)(1e-18 <= ABS(fVar64)) &
                            (uint)((DAT_01f46a60._4_4_ - fVar64 * fVar85) * fVar85 + fVar85));
            fVar78 = (float)(-(uint)(1e-18 <= ABS(fVar66)) &
                            (uint)((DAT_01f46a60._8_4_ - fVar66 * fVar78) * fVar78 + fVar78));
            fVar87 = (float)(-(uint)(1e-18 <= ABS(fVar68)) &
                            (uint)((DAT_01f46a60._12_4_ - fVar68 * fVar87) * fVar87 + fVar87));
            auVar93._0_4_ = local_918 * fVar79;
            auVar93._4_4_ = fStack_914 * fVar85;
            auVar93._8_4_ = fStack_910 * fVar78;
            auVar93._12_4_ = fStack_90c * fVar87;
            local_8c8 = minps(auVar93,_DAT_01f46a60);
            auVar75._0_4_ = fVar79 * local_908;
            auVar75._4_4_ = fVar85 * fStack_904;
            auVar75._8_4_ = fVar78 * fStack_900;
            auVar75._12_4_ = fVar87 * fStack_8fc;
            local_8b8 = minps(auVar75,_DAT_01f46a60);
            uVar39 = (ulong)(uVar32 & 0xff);
            do {
              uVar25 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              local_808 = *(uint *)((long)&local_928 + uVar25 * 4);
              pGVar23 = (pSVar17->geometries).items[local_808].ptr;
              if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_838 = *(undefined4 *)(local_8c8 + uVar25 * 4);
                  uVar15 = *(undefined4 *)(local_8b8 + uVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar25 * 4);
                  args.context = context->user;
                  uVar16 = *(undefined4 *)((long)&local_938 + uVar25 * 4);
                  local_818._4_4_ = uVar16;
                  local_818._0_4_ = uVar16;
                  local_818._8_4_ = uVar16;
                  local_818._12_4_ = uVar16;
                  local_828._4_4_ = uVar15;
                  local_828._0_4_ = uVar15;
                  local_828._8_4_ = uVar15;
                  local_828._12_4_ = uVar15;
                  local_868 = *(undefined4 *)(local_898 + uVar25 * 4);
                  local_858 = *(undefined4 *)(local_888 + uVar25 * 4);
                  uVar15 = *(undefined4 *)(local_878 + uVar25 * 4);
                  local_848._4_4_ = uVar15;
                  local_848._0_4_ = uVar15;
                  local_848._8_4_ = uVar15;
                  local_848._12_4_ = uVar15;
                  uStack_864 = local_868;
                  uStack_860 = local_868;
                  uStack_85c = local_868;
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_7f8 = (args.context)->instID[0];
                  uStack_7f4 = local_7f8;
                  uStack_7f0 = local_7f8;
                  uStack_7ec = local_7f8;
                  local_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = local_7e8;
                  uStack_7e0 = local_7e8;
                  uStack_7dc = local_7e8;
                  local_ae8 = *local_ad8;
                  args.valid = (int *)local_ae8;
                  args.geometryUserPtr = pGVar23->userPtr;
                  args.hit = (RTCHitN *)&local_868;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar23->occlusionFilterN)(&args);
                  }
                  if (local_ae8 == (undefined1  [16])0x0) {
                    auVar61._8_4_ = 0xffffffff;
                    auVar61._0_8_ = 0xffffffffffffffff;
                    auVar61._12_4_ = 0xffffffff;
                    auVar61 = auVar61 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var24 = context->args->filter;
                    if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var24)(&args);
                    }
                    auVar50._0_4_ = -(uint)(local_ae8._0_4_ == 0);
                    auVar50._4_4_ = -(uint)(local_ae8._4_4_ == 0);
                    auVar50._8_4_ = -(uint)(local_ae8._8_4_ == 0);
                    auVar50._12_4_ = -(uint)(local_ae8._12_4_ == 0);
                    auVar61 = auVar50 ^ _DAT_01f46b70;
                    auVar55 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar50
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
                  }
                  if ((_DAT_01f46b40 & auVar61) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar124;
                    goto LAB_006f6008;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_006f60ea;
              }
LAB_006f6008:
              uVar39 = uVar39 ^ 1L << (uVar25 & 0x3f);
            } while (uVar39 != 0);
          }
        }
      }
      uVar39 = local_ad0;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }